

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O3

Date_time * __thiscall iqxmlrpc::Value::cast<iqxmlrpc::Date_time>(Value *this)

{
  Date_time *pDVar1;
  Bad_cast *this_00;
  
  if (this->value != (Value_type *)0x0) {
    pDVar1 = (Date_time *)__dynamic_cast(this->value,&Value_type::typeinfo,&Date_time::typeinfo,0);
    if (pDVar1 != (Date_time *)0x0) {
      return pDVar1;
    }
  }
  this_00 = (Bad_cast *)__cxa_allocate_exception(0x18);
  Bad_cast::Bad_cast(this_00);
  __cxa_throw(this_00,&Bad_cast::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T* Value::cast() const
{
  T* t = dynamic_cast<T*>( value );
  if( !t )
    throw Bad_cast();
  return t;
}